

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

string * __thiscall Cmd::readlineNoTTY_abi_cxx11_(string *__return_storage_ptr__,Cmd *this)

{
  int iVar1;
  int ch;
  Cmd *this_local;
  string *line;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while ((iVar1 = fgetc((FILE *)this->in_), iVar1 != -1 && (iVar1 != 10))) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readlineNoTTY() const {
		std::string line;

		while (true) {
			const int ch = fgetc(in_);
			if (ch == EOF || ch == '\n') {
				return line;
			} else {
				line.push_back(ch);
			}
		}
	}